

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::minValue
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this)

{
  uint uVar1;
  long lVar2;
  long i;
  long lVar3;
  
  lVar3 = this->n;
  lVar2 = -lVar3;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  uVar1 = 0xff;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    if (this->pixel[lVar3] <= uVar1) {
      uVar1 = (uint)this->pixel[lVar3];
    }
  }
  return uVar1;
}

Assistant:

work_t minValue() const
    {
      work_t ret=ptraits::maxValue();

      long pn=std::abs(n);
      for (long i=0; i<pn; i++)
      {
        if (isValidS(pixel[i]))
        {
          ret=std::min(ret, static_cast<work_t>(pixel[i]));
        }
      }

      return ret;
    }